

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool __thiscall
cmForEachCommand::HandleInMode
          (cmForEachCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  int iVar2;
  bool bVar3;
  cmForEachFunctionBlocker *this_01;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  value_type *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int iVar8;
  string local_1c8;
  ostringstream e;
  
  this_01 = (cmForEachFunctionBlocker *)operator_new(0x90);
  cmForEachFunctionBlocker::cmForEachFunctionBlocker(this_01,(this->super_cmCommand).Makefile);
  this_02 = &this_01->Args;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_02,(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  iVar8 = 0;
  uVar6 = 2;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6) {
      cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_01);
      return true;
    }
    __lhs = pbVar1 + uVar6;
    if (iVar8 == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_02,__lhs);
      iVar2 = 2;
    }
    else {
      bVar3 = std::operator==(__lhs,"LISTS");
      iVar7 = 1;
      iVar2 = iVar7;
      if (!bVar3) {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6,"ITEMS");
        iVar2 = 2;
        if (!bVar3) {
          if (iVar8 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar5 = std::operator<<((ostream *)&e,"Unknown argument:\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + uVar6));
            std::operator<<(poVar5,"\n");
            this_00 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c8,false);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            (*(this_01->super_cmFunctionBlocker)._vptr_cmFunctionBlocker[3])(this_01);
            return true;
          }
          pcVar4 = cmMakefile::GetDefinition
                             ((this->super_cmCommand).Makefile,
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar6);
          iVar2 = iVar7;
          if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
            std::__cxx11::string::string((string *)&e,pcVar4,(allocator *)&local_1c8);
            cmSystemTools::ExpandListArgument((string *)&e,this_02,true);
            std::__cxx11::string::~string((string *)&e);
          }
        }
      }
    }
    iVar8 = iVar2;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

bool cmForEachCommand::HandleInMode(std::vector<std::string> const& args)
{
  cmsys::auto_ptr<cmForEachFunctionBlocker>
    f(new cmForEachFunctionBlocker(this->Makefile));
  f->Args.push_back(args[0]);

  enum Doing { DoingNone, DoingLists, DoingItems };
  Doing doing = DoingNone;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(doing == DoingItems)
      {
      f->Args.push_back(args[i]);
      }
    else if(args[i] == "LISTS")
      {
      doing = DoingLists;
      }
    else if(args[i] == "ITEMS")
      {
      doing = DoingItems;
      }
    else if(doing == DoingLists)
      {
      const char* value = this->Makefile->GetDefinition(args[i]);
      if(value && *value)
        {
        cmSystemTools::ExpandListArgument(value, f->Args, true);
        }
      }
    else
      {
      std::ostringstream e;
      e << "Unknown argument:\n" << "  " << args[i] << "\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return true;
      }
    }

  this->Makefile->AddFunctionBlocker(f.release()); // TODO: pass auto_ptr

  return true;
}